

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twolevel.c
# Opt level: O0

void evict_demote(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  long lVar1;
  void *__ptr;
  void *pvVar2;
  void *buf;
  size_t vsize;
  VMEMcache *colder;
  void *arg_local;
  size_t key_size_local;
  void *key_local;
  VMEMcache *cache_local;
  
  vsize = (size_t)arg;
  colder = (VMEMcache *)arg;
  arg_local = (void *)key_size;
  key_size_local = (size_t)key;
  key_local = cache;
  lVar1 = vmemcache_get(cache,key,key_size,0,0,0,&buf);
  if ((lVar1 == 0) && (__ptr = malloc((size_t)buf), __ptr != (void *)0x0)) {
    pvVar2 = (void *)vmemcache_get(key_local,key_size_local,arg_local,__ptr,buf,0,0);
    if (pvVar2 == buf) {
      vmemcache_put(vsize,key_size_local,arg_local,__ptr,buf);
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
evict_demote(VMEMcache *cache, const void *key, size_t key_size, void *arg)
{
	VMEMcache *colder = (VMEMcache *)arg;

	size_t vsize;
	/* First, obtain the value's size. */
	if (vmemcache_get(cache, key, key_size, NULL, 0, 0, &vsize))
		return; /* Somehow got deleted? -- can't happen. */
	void *buf = malloc(vsize);
	if (!buf)
		return;
	/* Then, fetch the value. */
	if (vmemcache_get(cache, key, key_size, buf, vsize, 0, NULL) ==
		(ssize_t)vsize) {
		/* Again, it's not supposed to be missing. */
		vmemcache_put(colder, key, key_size, buf, vsize);
	}
	free(buf);
}